

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O0

void Abc_NtkCollectNodesByArea(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Vec_Flt_t *p_00;
  Vec_Que_t *p_01;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pObj_00;
  SC_Cell *pSVar3;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  SC_Man *p_local;
  
  iVar1 = Vec_QueSize(p->vNodeByGain);
  if (iVar1 != 0) {
    __assert_fail("Vec_QueSize(p->vNodeByGain) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclDnsize.c"
                  ,0xb5,"void Abc_NtkCollectNodesByArea(SC_Man *, Abc_Ntk_t *)");
  }
  Vec_QueClear(p->vNodeByGain);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_24);
    if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
       (iVar1 = Abc_ObjFaninNum(pObj_00), 0 < iVar1)) {
      p_00 = p->vNode2Gain;
      uVar2 = Abc_ObjId(pObj_00);
      pSVar3 = Abc_SclObjCell(pObj_00);
      Vec_FltWriteEntry(p_00,uVar2,pSVar3->area);
      p_01 = p->vNodeByGain;
      uVar2 = Abc_ObjId(pObj_00);
      Vec_QuePush(p_01,uVar2);
    }
  }
  return;
}

Assistant:

void Abc_NtkCollectNodesByArea( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_QueSize(p->vNodeByGain) == 0 );
    Vec_QueClear( p->vNodeByGain );
    Abc_NtkForEachNode( pNtk, pObj, i )
    if ( Abc_ObjFaninNum(pObj) > 0 )
    {
        Vec_FltWriteEntry( p->vNode2Gain, Abc_ObjId(pObj), Abc_SclObjCell(pObj)->area );
        Vec_QuePush( p->vNodeByGain, Abc_ObjId(pObj) );
    }
}